

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O0

void FT_GlyphLoader_Adjust_Points(FT_GlyphLoader loader)

{
  short *local_38;
  char *local_30;
  FT_Vector *local_28;
  FT_Outline *current;
  FT_Outline *base;
  FT_GlyphLoader loader_local;
  
  if ((loader->base).outline.points == (FT_Vector *)0x0) {
    local_28 = (FT_Vector *)0x0;
  }
  else {
    local_28 = (loader->base).outline.points + (int)(loader->base).outline.n_points;
  }
  (loader->current).outline.points = local_28;
  if ((loader->base).outline.tags == (char *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = (loader->base).outline.tags + (int)(loader->base).outline.n_points;
  }
  (loader->current).outline.tags = local_30;
  if ((loader->base).outline.contours == (short *)0x0) {
    local_38 = (short *)0x0;
  }
  else {
    local_38 = (loader->base).outline.contours + (int)(loader->base).outline.n_contours;
  }
  (loader->current).outline.contours = local_38;
  if (loader->use_extra != '\0') {
    (loader->current).extra_points =
         (loader->base).extra_points + (int)(loader->base).outline.n_points;
    (loader->current).extra_points2 =
         (loader->base).extra_points2 + (int)(loader->base).outline.n_points;
  }
  return;
}

Assistant:

static void
  FT_GlyphLoader_Adjust_Points( FT_GlyphLoader  loader )
  {
    FT_Outline*  base    = &loader->base.outline;
    FT_Outline*  current = &loader->current.outline;


    current->points   = FT_OFFSET( base->points,   base->n_points );
    current->tags     = FT_OFFSET( base->tags,     base->n_points );
    current->contours = FT_OFFSET( base->contours, base->n_contours );

    /* handle extra points table - if any */
    if ( loader->use_extra )
    {
      loader->current.extra_points  = loader->base.extra_points +
                                      base->n_points;

      loader->current.extra_points2 = loader->base.extra_points2 +
                                      base->n_points;
    }
  }